

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::BSSRDFAdapter::f(BSSRDFAdapter *this,Vector3f *wo,Vector3f *wi,TransportMode mode)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  SampledSpectrum SVar16;
  undefined1 extraout_var [60];
  
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  if (0.0 < (wo->super_Tuple3<pbrt::Vector3,_float>).z * (wi->super_Tuple3<pbrt::Vector3,_float>).z)
  {
    auVar13._0_4_ = FresnelMoment1(1.0 / this->eta);
    auVar13._4_60_ = extraout_var;
    fVar1 = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar14 = SUB6416(ZEXT464(0x3f800000),0);
    auVar4 = vfmadd132ss_fma(auVar13._0_16_,auVar14,ZEXT416(0xc0000000));
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar10);
    auVar12 = vminss_avx(auVar14,ZEXT416((uint)fVar1));
    uVar2 = vcmpss_avx512f(auVar14,ZEXT416((uint)fVar1),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    bVar6 = fVar1 < -1.0;
    auVar11._4_12_ = auVar10._4_12_;
    fVar8 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar12._0_4_);
    fVar1 = this->eta;
    bVar7 = 0.0 < fVar8;
    auVar11._0_4_ =
         (uint)bVar7 * (int)fVar8 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar10._0_4_));
    fVar8 = 1.0;
    auVar12 = vfnmadd213ss_fma(auVar11,auVar11,auVar14);
    auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x40);
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar9 = (float)((uint)bVar7 * (int)fVar1 + (uint)!bVar7 * (int)(1.0 / fVar1));
    auVar10 = ZEXT416((uint)fVar9);
    auVar14._0_4_ = auVar12._0_4_ / fVar9;
    auVar14._4_12_ = auVar12._4_12_;
    if (auVar14._0_4_ < 1.0) {
      auVar12 = vfnmadd213ss_fma(auVar14,auVar14,ZEXT416(0x3f800000));
      auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x20);
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      auVar5 = vfmsub213ss_fma(auVar11,auVar10,auVar12);
      auVar14 = vfmadd213ss_fma(auVar11,auVar10,auVar12);
      auVar15._0_4_ = auVar5._0_4_ / auVar14._0_4_;
      auVar15._4_12_ = auVar5._4_12_;
      auVar14 = vfnmadd213ss_fma(auVar12,auVar10,auVar11);
      auVar12 = vfmadd213ss_fma(auVar12,auVar10,auVar11);
      fVar8 = auVar14._0_4_ / auVar12._0_4_;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar15,auVar15);
      fVar8 = auVar12._0_4_ * 0.5;
    }
    auVar12._0_4_ = (1.0 - fVar8) / (auVar4._0_4_ * 3.1415927);
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar12._0_4_;
    auVar12._12_4_ = auVar12._0_4_;
    if (mode == Radiance) {
      fVar1 = fVar1 * fVar1 * auVar12._0_4_;
      auVar12._4_4_ = fVar1;
      auVar12._0_4_ = fVar1;
      auVar12._8_4_ = fVar1;
      auVar12._12_4_ = fVar1;
    }
  }
  auVar4 = vshufpd_avx(auVar12,auVar12,1);
  SVar16.values.values._0_8_ = auVar12._0_8_;
  SVar16.values.values._8_8_ = auVar4._0_8_;
  return (SampledSpectrum)SVar16.values.values;
}

Assistant:

PBRT_CPU_GPU
inline bool SameHemisphere(const Vector3f &w, const Vector3f &wp) {
    return w.z * wp.z > 0;
}